

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

bool __thiscall ON_Viewport::Write(ON_Viewport *this,ON_BinaryArchive *file)

{
  bool bVar1;
  int iVar2;
  double local_40;
  double scaleZ;
  double scaleY;
  double scaleX;
  view_projection local_20;
  bool b;
  int i;
  bool rc;
  ON_BinaryArchive *file_local;
  ON_Viewport *this_local;
  
  _i = file;
  file_local = (ON_BinaryArchive *)this;
  b = ON_BinaryArchive::Write3dmChunkVersion(file,1,5);
  if (b) {
    local_20 = (view_projection)((this->m_bValidCamera & 1U) != 0);
    if (b) {
      b = ON_BinaryArchive::WriteInt(_i,local_20);
    }
    local_20 = (view_projection)((this->m_bValidFrustum & 1U) != 0);
    if (b != false) {
      b = ON_BinaryArchive::WriteInt(_i,local_20);
    }
    local_20 = (view_projection)((this->m_bValidPort & 1U) != 0);
    if (b != false) {
      b = ON_BinaryArchive::WriteInt(_i,local_20);
    }
    local_20 = this->m_projection;
    iVar2 = ON_BinaryArchive::Archive3dmVersion(_i);
    if ((iVar2 < 5) && (bVar1 = IsPerspectiveProjection(this), bVar1)) {
      local_20 = perspective_view;
    }
    if ((b & 1U) != 0) {
      b = ON_BinaryArchive::WriteInt(_i,local_20);
    }
    if ((b & 1U) != 0) {
      b = ON_BinaryArchive::WritePoint(_i,&this->m_CamLoc);
    }
    if ((b & 1U) != 0) {
      b = ON_BinaryArchive::WriteVector(_i,&this->m_CamDir);
    }
    if ((b & 1U) != 0) {
      b = ON_BinaryArchive::WriteVector(_i,&this->m_CamUp);
    }
    if ((b & 1U) != 0) {
      b = ON_BinaryArchive::WriteVector(_i,&this->m_CamX);
    }
    if ((b & 1U) != 0) {
      b = ON_BinaryArchive::WriteVector(_i,&this->m_CamY);
    }
    if ((b & 1U) != 0) {
      b = ON_BinaryArchive::WriteVector(_i,&this->m_CamZ);
    }
    if ((b & 1U) != 0) {
      b = ON_BinaryArchive::WriteDouble(_i,this->m_frus_left);
    }
    if ((b & 1U) != 0) {
      b = ON_BinaryArchive::WriteDouble(_i,this->m_frus_right);
    }
    if ((b & 1U) != 0) {
      b = ON_BinaryArchive::WriteDouble(_i,this->m_frus_bottom);
    }
    if ((b & 1U) != 0) {
      b = ON_BinaryArchive::WriteDouble(_i,this->m_frus_top);
    }
    if ((b & 1U) != 0) {
      b = ON_BinaryArchive::WriteDouble(_i,this->m_frus_near);
    }
    if ((b & 1U) != 0) {
      b = ON_BinaryArchive::WriteDouble(_i,this->m_frus_far);
    }
    if ((b & 1U) != 0) {
      b = ON_BinaryArchive::WriteInt(_i,this->m_port_left);
    }
    if ((b & 1U) != 0) {
      b = ON_BinaryArchive::WriteInt(_i,this->m_port_right);
    }
    if ((b & 1U) != 0) {
      b = ON_BinaryArchive::WriteInt(_i,this->m_port_bottom);
    }
    if ((b & 1U) != 0) {
      b = ON_BinaryArchive::WriteInt(_i,this->m_port_top);
    }
    if ((b & 1U) != 0) {
      b = ON_BinaryArchive::WriteInt(_i,this->m_port_near);
    }
    if ((b & 1U) != 0) {
      b = ON_BinaryArchive::WriteInt(_i,this->m_port_far);
    }
    if ((b & 1U) != 0) {
      b = ON_BinaryArchive::WriteUuid(_i,&this->m_viewport_id);
    }
    scaleX._7_1_ = CameraUpIsLocked(this);
    if ((b & 1U) != 0) {
      b = ON_BinaryArchive::WriteBool(_i,(bool)scaleX._7_1_);
    }
    scaleX._7_1_ = CameraDirectionIsLocked(this);
    if ((b & 1U) != 0) {
      b = ON_BinaryArchive::WriteBool(_i,(bool)scaleX._7_1_);
    }
    scaleX._7_1_ = CameraLocationIsLocked(this);
    if ((b & 1U) != 0) {
      b = ON_BinaryArchive::WriteBool(_i,(bool)scaleX._7_1_);
    }
    scaleX._7_1_ = FrustumIsLeftRightSymmetric(this);
    if ((b & 1U) != 0) {
      b = ON_BinaryArchive::WriteBool(_i,(bool)scaleX._7_1_);
    }
    scaleX._7_1_ = FrustumIsTopBottomSymmetric(this);
    if ((b & 1U) != 0) {
      b = ON_BinaryArchive::WriteBool(_i,(bool)scaleX._7_1_);
    }
    if ((b & 1U) != 0) {
      b = ON_BinaryArchive::WritePoint(_i,&this->m_target_point);
    }
    if ((b & 1U) != 0) {
      b = ON_BinaryArchive::WriteBool(_i,(bool)(this->m_bValidCameraFrame & 1));
    }
    if ((b & 1U) != 0) {
      scaleY = 1.0;
      scaleZ = 1.0;
      local_40 = 1.0;
      GetViewScale(this,&scaleY,&scaleZ,&local_40);
      b = ON_BinaryArchive::WriteDouble(_i,scaleY);
      if (b) {
        b = ON_BinaryArchive::WriteDouble(_i,scaleZ);
      }
      if (b != false) {
        b = ON_BinaryArchive::WriteDouble(_i,local_40);
      }
    }
  }
  return (bool)(b & 1);
}

Assistant:

bool ON_Viewport::Write( ON_BinaryArchive& file ) const
{
  // 10 Jan 2022 S. Baer
  // version 1.5: write view scale
  bool rc = file.Write3dmChunkVersion(1,5);
  if (rc) 
  {
    int i = m_bValidCamera?1:0;
    if (rc) rc = file.WriteInt( i );
    i = m_bValidFrustum?1:0;
    if (rc) rc = file.WriteInt( i );
    i = m_bValidPort?1:0;
    if (rc) rc = file.WriteInt( i );
    i = m_projection;
    if ( file.Archive3dmVersion() <= 4 && IsPerspectiveProjection() )
    {
      // V4 files do not support 2 point perspective projection
      i = ON::perspective_view;
    }
    if (rc) rc = file.WriteInt( i );
    if (rc) rc = file.WritePoint( m_CamLoc );
    if (rc) rc = file.WriteVector( m_CamDir );
    if (rc) rc = file.WriteVector( m_CamUp );
    if (rc) rc = file.WriteVector( m_CamX );
    if (rc) rc = file.WriteVector( m_CamY );
    if (rc) rc = file.WriteVector( m_CamZ );
    if (rc) rc = file.WriteDouble( m_frus_left );
    if (rc) rc = file.WriteDouble( m_frus_right );
    if (rc) rc = file.WriteDouble( m_frus_bottom );
    if (rc) rc = file.WriteDouble( m_frus_top );
    if (rc) rc = file.WriteDouble( m_frus_near );
    if (rc) rc = file.WriteDouble( m_frus_far );
    if (rc) rc = file.WriteInt( m_port_left );
    if (rc) rc = file.WriteInt( m_port_right );
    if (rc) rc = file.WriteInt( m_port_bottom );
    if (rc) rc = file.WriteInt( m_port_top );
    if (rc) rc = file.WriteInt( m_port_near );
    if (rc) rc = file.WriteInt( m_port_far );    

    // 1.1 fields
    if (rc) rc = file.WriteUuid(m_viewport_id);

    // 1.2 fields 
    bool b;

    b = CameraUpIsLocked();
    if (rc) rc = file.WriteBool(b);

    b = CameraDirectionIsLocked();
    if (rc) rc = file.WriteBool(b);

    b = CameraLocationIsLocked();
    if (rc) rc = file.WriteBool(b);

    b = FrustumIsLeftRightSymmetric();
    if (rc) rc = file.WriteBool(b);

    b = FrustumIsTopBottomSymmetric();
    if (rc) rc = file.WriteBool(b);

    // 1.3 fields - added 18, June 2013 to V6
    if (rc) rc = file.WritePoint(m_target_point);

    // 1.4 fields - added Oct 13 2016 to V6
    if (rc) rc = file.WriteBool(m_bValidCameraFrame);

    // 1.5 fields - added Jan 10 2022 to V8
    if (rc)
    {
      double scaleX = 1.0, scaleY = 1.0, scaleZ = 1.0;
      GetViewScale(&scaleX, &scaleY, &scaleZ);
      rc = file.WriteDouble(scaleX);
      if (rc) rc = file.WriteDouble(scaleY);
      if (rc) rc = file.WriteDouble(scaleZ);
    }
  }
  return rc;
}